

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolu.c
# Opt level: O0

int ffpcluc(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
           int *status)

{
  int iVar1;
  size_t sVar2;
  uint in_ESI;
  long in_R8;
  fitsfile *in_R9;
  size_t buffsize;
  long jbuff [2];
  char snull [20];
  char message [81];
  char *cstring;
  char tform [20];
  uchar lognul;
  uchar i1null;
  double zero;
  double scale;
  LONGLONG ntodo;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG wrtptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  LONGLONG i8null;
  LONGLONG tnull;
  LONGLONG ii;
  long incre;
  long twidth;
  int i4null;
  short i2null;
  int leng;
  int writemode;
  int hdutype;
  int maxelem;
  int tcode;
  undefined1 *nvals;
  int *in_stack_fffffffffffffd80;
  double *dvalues;
  long *in_stack_fffffffffffffd88;
  undefined1 *nvals_00;
  long *in_stack_fffffffffffffd90;
  size_t *svalues;
  int *in_stack_fffffffffffffd98;
  fitsfile *fptr_00;
  undefined8 in_stack_fffffffffffffda0;
  fitsfile *in_stack_fffffffffffffda8;
  int *status_00;
  long *buffer;
  undefined1 *nbytes;
  fitsfile *fptr_01;
  long local_200;
  size_t local_1f8;
  undefined8 in_stack_fffffffffffffe40;
  LONGLONG nelem_00;
  LONGLONG firstelem_00;
  char in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe59;
  int in_stack_fffffffffffffe64;
  fitsfile *in_stack_fffffffffffffe68;
  char local_188 [8];
  double *in_stack_fffffffffffffe80;
  double *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  long *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  int *in_stack_fffffffffffffea8;
  LONGLONG *in_stack_fffffffffffffeb0;
  LONGLONG *in_stack_fffffffffffffeb8;
  long *in_stack_fffffffffffffec0;
  LONGLONG *in_stack_fffffffffffffec8;
  LONGLONG *rowlen_00;
  int *in_stack_fffffffffffffed8;
  LONGLONG *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 uVar3;
  undefined1 in_stack_fffffffffffffef7;
  double local_108;
  undefined1 local_100 [8];
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  size_t local_90;
  undefined4 local_84;
  undefined2 local_7e;
  int local_7c;
  undefined4 local_78;
  int local_74 [2];
  undefined1 local_6c [12];
  long local_60;
  uint local_44;
  int local_34;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  local_78 = 2;
  uVar3 = 0;
  rowlen_00 = (LONGLONG *)0x0;
  nelem_00 = -1;
  firstelem_00 = -1;
  if (in_R9->HDUposition < 1) {
    local_6c._4_8_ = in_R9;
    local_60 = in_R8;
    local_44 = in_ESI;
    ffgtcl(in_stack_fffffffffffffda8,(int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
           in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
           in_stack_fffffffffffffd80);
    if ((int)local_6c._0_4_ < 0) {
      local_78 = 0;
    }
    nvals_00 = &stack0xfffffffffffffed8;
    nbytes = &stack0xfffffffffffffe58;
    nvals = local_100;
    dvalues = &local_108;
    svalues = &local_90;
    fptr_00 = (fitsfile *)local_6c;
    status_00 = local_74;
    buffer = &local_a8;
    fptr_01 = (fitsfile *)local_6c._4_8_;
    iVar1 = ffgcprll(in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                     CONCAT71(in_stack_fffffffffffffe59,in_stack_fffffffffffffe58),firstelem_00,
                     nelem_00,iVar1,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,rowlen_00,
                     in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
                     (int *)CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(uVar3,in_stack_fffffffffffffef0)));
    if (iVar1 < 1) {
      if (local_6c._0_4_ == 0x10) {
        if (in_stack_fffffffffffffe58 == '\x01') {
          ffpmsg((char *)0x223389);
          *(int *)local_6c._4_8_ = 0x13a;
          return 0x13a;
        }
        if ((long)local_90 < 0x14) {
          local_1f8 = 0x14;
        }
        else {
          local_1f8 = local_90;
        }
        rowlen_00 = (LONGLONG *)malloc(local_1f8);
        if (rowlen_00 == (LONGLONG *)0x0) {
          *(int *)local_6c._4_8_ = 0x71;
          return 0x71;
        }
        memset(rowlen_00,0x20,local_1f8);
        sVar2 = strlen(&stack0xfffffffffffffe58);
        local_7c = (int)sVar2;
        if (local_74[0] == 2) {
          local_7c = local_7c + 1;
        }
        strncpy((char *)rowlen_00,&stack0xfffffffffffffe58,(long)local_7c);
      }
      else if ((((local_6c._0_4_ == 0xb) || (local_6c._0_4_ == 0x15)) || (local_6c._0_4_ == 0x29))
              || (local_6c._0_4_ == 0x51)) {
        if (local_a8 == 0x4995cdd1) {
          ffpmsg((char *)0x2234d4);
          *(int *)local_6c._4_8_ = 0x13a;
          return 0x13a;
        }
        if (local_6c._0_4_ != 0xb) {
          if (local_6c._0_4_ == 0x15) {
            local_7e = (undefined2)local_a8;
            ffswap2((short *)svalues,(long)nvals_00);
          }
          else if (local_6c._0_4_ == 0x29) {
            local_84 = (undefined4)local_a8;
            ffswap4((int *)dvalues,(long)nvals);
          }
          else {
            local_b0 = local_a8;
            ffswap8(dvalues,(long)nvals);
          }
        }
      }
      local_e8 = local_60;
      local_f0 = 0;
      local_e0 = 0;
      while (local_e8 != 0) {
        if (local_e8 < local_b8 - local_c8) {
          local_200 = local_e8;
        }
        else {
          local_200 = local_b8 - local_c8;
        }
        local_f8 = local_200;
        local_d0 = local_c0 + local_e0 * local_d8 + local_c8 * local_98;
        ffmbyt(fptr_00,(LONGLONG)svalues,(int)((ulong)nvals_00 >> 0x20),(int *)dvalues);
        switch(local_6c._0_4_) {
        case 0xb:
          for (local_a0 = 0; local_a0 < local_f8; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        default:
          snprintf(local_188,0x51,"Cannot write null value to column %d which has format %s",
                   (ulong)local_44,&stack0xfffffffffffffed8);
          ffpmsg((char *)0x2239a0);
          return *(int *)local_6c._4_8_;
        case 0xe:
          for (local_a0 = 0; local_a0 < local_f8; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        case 0x10:
          ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          break;
        case 0x15:
          for (local_a0 = 0; local_a0 < local_f8; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        case 0x29:
          for (local_a0 = 0; local_a0 < local_f8; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        case 0x2a:
          for (local_a0 = 0; local_a0 < local_f8; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        case 0x51:
          for (local_a0 = 0; local_a0 < local_f8; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        case 0x52:
          for (local_a0 = 0; local_a0 < local_f8; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
        }
        if (0 < *(int *)local_6c._4_8_) {
          snprintf(local_188,0x51,"Error writing %.0f thru %.0f of null values (ffpclu).",
                   (double)(local_f0 + 1),(double)(local_f0 + local_f8));
          ffpmsg((char *)0x223a11);
          if (rowlen_00 != (LONGLONG *)0x0) {
            free(rowlen_00);
          }
          return *(int *)local_6c._4_8_;
        }
        local_e8 = local_e8 - local_f8;
        if (local_e8 != 0) {
          local_f0 = local_f8 + local_f0;
          local_c8 = local_f8 + local_c8;
          if (local_c8 == local_b8) {
            local_c8 = 0;
            local_e0 = local_e0 + 1;
          }
        }
      }
      if (rowlen_00 != (LONGLONG *)0x0) {
        local_f8 = local_e8;
        free(rowlen_00);
      }
      local_34 = *(int *)local_6c._4_8_;
    }
    else {
      local_34 = *(int *)local_6c._4_8_;
    }
  }
  else {
    local_34 = in_R9->HDUposition;
  }
  return local_34;
}

Assistant:

int ffpcluc( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            int  *status)    /* IO - error status                           */
/*
  Set elements of a table column to the appropriate null value for the column
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer to a virtual column in a 1 or more grouped FITS primary
  array.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.
  
  This routine does not do anything special in the case of COMPLEX table columns
  (unlike the similar ffpclu routine).  This routine is mainly for use by
  ffpcne which already compensates for the effective doubling of the number of 
  elements in a complex column.
*/
{
    int tcode, maxelem, hdutype, writemode = 2, leng;
    short i2null;
    INT32BIT i4null;
    long twidth, incre;
    LONGLONG ii;
    LONGLONG tnull, i8null;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, ntodo;
    double scale, zero;
    unsigned char i1null, lognul = 0;
    char tform[20], *cstring = 0;
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    long   jbuff[2] = { -1, -1};  /* all bits set is equivalent to a NaN */
    size_t buffsize;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/

    /* note that writemode = 2 by default (not 1), so that the returned */
    /* repeat and incre values will be the actual values for this column. */

    /* If writing nulls to a variable length column then dummy data values  */
    /* must have already been written to the heap. */
    /* We just have to overwrite the previous values with null values. */
    /* Set writemode = 0 in this case, to test that values have been written */

    fits_get_coltype(fptr, colnum, &tcode, NULL, NULL, status);
    if (tcode < 0)
         writemode = 0;  /* this is a variable length column */
    
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, writemode, &scale,
       &zero, tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode == TSTRING)
    {
      if (snull[0] == ASCII_NULL_UNDEFINED)
      {
        ffpmsg(
        "Null value string for ASCII table column is not defined (FTPCLU).");
        return(*status = NO_NULL);
      }

      /* allocate buffer to hold the null string.  Must write the entire */
      /* width of the column (twidth bytes) to avoid possible problems */
      /* with uninitialized FITS blocks, in case the field spans blocks */

      buffsize = maxvalue(20, twidth);
      cstring = (char *) malloc(buffsize);
      if (!cstring)
         return(*status = MEMORY_ALLOCATION);

      memset(cstring, ' ', buffsize);  /* initialize  with blanks */

      leng = strlen(snull);
      if (hdutype == BINARY_TBL)
         leng++;        /* copy the terminator too in binary tables */

      strncpy(cstring, snull, leng);  /* copy null string to temp buffer */

    }
    else if ( tcode == TBYTE  ||
              tcode == TSHORT ||
              tcode == TLONG  ||
              tcode == TLONGLONG) 
    {
      if (tnull == NULL_UNDEFINED)
      {
        ffpmsg(
        "Null value for integer table column is not defined (FTPCLU).");
        return(*status = NO_NULL);
      }

      if (tcode == TBYTE)
         i1null = (unsigned char) tnull;
      else if (tcode == TSHORT)
      {
         i2null = (short) tnull;
#if BYTESWAPPED
         ffswap2(&i2null, 1); /* reverse order of bytes */
#endif
      }
      else if (tcode == TLONG)
      {
         i4null = (INT32BIT) tnull;
#if BYTESWAPPED
         ffswap4(&i4null, 1); /* reverse order of bytes */
#endif
      }
      else
      {
         i8null = tnull;
#if BYTESWAPPED
         ffswap8((double *)(&i8null), 1);  /* reverse order of bytes */
#endif
      }
    }

    /*---------------------------------------------------------------------*/
    /*  Now write the pixels to the FITS column.                           */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */
    ntodo = remain;           /* number of elements to write at one time */

    while (ntodo)
    {
        /* limit the number of pixels to process at one time to the number that
           will fit in the buffer space or to the number of pixels that remain
           in the current vector, which ever is smaller.
        */
        ntodo = minvalue(ntodo, (repeat - elemnum));
        wrtptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);

        ffmbyt(fptr, wrtptr, IGNORE_EOF, status); /* move to write position */

        switch (tcode) 
        {
            case (TBYTE):
 
                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 1,  &i1null, status);
                break;

            case (TSHORT):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 2, &i2null, status);
                break;

            case (TLONG):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 4, &i4null, status);
                break;

            case (TLONGLONG):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 8, &i8null, status);
                break;

            case (TFLOAT):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 4, jbuff, status);
                break;

            case (TDOUBLE):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 8, jbuff, status);
                break;

            case (TLOGICAL):
 
                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 1, &lognul, status);
                break;

            case (TSTRING):  /* an ASCII table column */
                /* repeat always = 1, so ntodo is also guaranteed to = 1 */
                ffpbyt(fptr, twidth, cstring, status);
                break;

            default:  /*  error trap  */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot write null value to column %d which has format %s",
                     colnum,tform);
                ffpmsg(message);
                return(*status);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous write operation */
        {
           snprintf(message,FLEN_ERRMSG,
             "Error writing %.0f thru %.0f of null values (ffpclu).",
              (double) (next+1), (double) (next+ntodo));
           ffpmsg(message);

           if (cstring)
              free(cstring);

           return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum += ntodo;
            if (elemnum == repeat)  /* completed a row; start on next row */
            {
                elemnum = 0;
                rownum++;
            }
        }
        ntodo = remain;  /* this is the maximum number to do in next loop */

    }  /*  End of main while Loop  */

    if (cstring)
       free(cstring);

    return(*status);
}